

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int Wlc_NtkPrepareBits(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int Id;
  int Entry;
  
  Entry = 0;
  Vec_IntFill(&p->vCopies,p->nObjsAlloc,0);
  for (Id = 1; Id < p->iObj; Id = Id + 1) {
    pWVar2 = Wlc_NtkObj(p,Id);
    Vec_IntWriteEntry(&p->vCopies,Id,Entry);
    iVar1 = pWVar2->End - pWVar2->Beg;
    iVar3 = -iVar1;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    Entry = Entry + iVar3 + 1;
  }
  return Entry;
}

Assistant:

int Wlc_NtkPrepareBits( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, nBits = 0;
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Wlc_ObjSetCopy( p, i, nBits );
        nBits += Wlc_ObjRange(pObj);
    }
    return nBits;
}